

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

pair<error,_int> parse_insn(context *ctx,opcode *op,insn *insn)

{
  bool bVar1;
  uint64_t *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar2;
  pair<error,_int> pVar3;
  undefined1 local_b0 [8];
  undefined1 local_a8 [8];
  error message_1;
  error message;
  operand *operand;
  const_iterator __end1;
  const_iterator __begin1;
  vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
  *__range1;
  int score;
  int local_5c;
  undefined1 local_58 [16];
  token token;
  insn *insn_local;
  opcode *op_local;
  context *ctx_local;
  
  token._32_8_ = in_RCX;
  opcode::add_bits((opcode *)insn,*in_RCX);
  context::tokenize((token *)(local_58 + 8),(context *)op);
  if (((*(uint *)(token._32_8_ + 0x14) & 1) == 0) ||
     (((insn->opcode ^ 0xffffffffffffffff) & 0x70000) == 0)) {
    __range1._0_4_ = 1;
    __end1 = std::
             vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
             ::begin((vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                      *)(token._32_8_ + 0x18));
    operand = (operand *)
              std::
              vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
              ::end((vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                     *)(token._32_8_ + 0x18));
    while (bVar1 = __gnu_cxx::
                   operator==<error_(*const_*)(context_&,_token_&,_opcode_&),_std::vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>_>
                             (&__end1,(__normal_iterator<error_(*const_*)(context_&,_token_&,_opcode_&),_std::vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>_>
                                       *)&operand), ((bVar1 ^ 0xffU) & 1) != 0) {
      message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (unique_ptr<char[],_std::default_delete<char[]>_>)
           __gnu_cxx::
           __normal_iterator<error_(*const_*)(context_&,_token_&,_opcode_&),_std::vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>_>
           ::operator*(&__end1);
      (**(_func_error_context_ptr_token_ptr_opcode_ptr **)
         message.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
         super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl)
                ((context *)&stack0xffffffffffffff68,(token *)op,(opcode *)(local_58 + 8));
      bVar1 = error::operator_cast_to_bool((error *)&stack0xffffffffffffff68);
      if (bVar1) {
        std::pair<error,_int>::pair<error,_int_&,_true>
                  ((pair<error,_int> *)ctx,(error *)&stack0xffffffffffffff68,(int *)&__range1);
      }
      message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._5_3_ = 0;
      message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
      super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
      super__Head_base<0UL,_char_*,_false>._M_head_impl._4_1_ = bVar1;
      error::~error((error *)&stack0xffffffffffffff68);
      uVar2 = extraout_RDX_00;
      if (message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ != 0) goto LAB_0012b73e;
      __range1._0_4_ = (int)__range1 + 1;
      __gnu_cxx::
      __normal_iterator<error_(*const_*)(context_&,_token_&,_opcode_&),_std::vector<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>_>
      ::operator++(&__end1);
    }
    __range1._0_4_ = (int)__range1 + 1000;
    assemble_sched((context *)local_a8,(token *)op,(opcode *)(local_58 + 8));
    bVar1 = error::operator_cast_to_bool((error *)local_a8);
    if (bVar1) {
      std::pair<error,_int>::pair<error,_int_&,_true>
                ((pair<error,_int> *)ctx,(error *)local_a8,(int *)&__range1);
    }
    message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl._5_3_ = 0;
    message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl._4_1_ = bVar1;
    error::~error((error *)local_a8);
    uVar2 = extraout_RDX_01;
    if (message_1.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl._4_4_ == 0) {
      confirm_type((token *)local_b0,(int)local_58 + tilde);
      std::pair<error,_int>::pair<error,_int_&,_true>
                ((pair<error,_int> *)ctx,(error *)local_b0,(int *)&__range1);
      error::~error((error *)local_b0);
      uVar2 = extraout_RDX_02;
    }
  }
  else {
    fail((token *)local_58,local_58 + 8,"%s does not support predicated execution",token._32_8_ + 8)
    ;
    local_5c = 0;
    std::pair<error,_int>::pair<error,_int,_true>
              ((pair<error,_int> *)ctx,(error *)local_58,&local_5c);
    error::~error((error *)local_58);
    uVar2 = extraout_RDX;
  }
LAB_0012b73e:
  pVar3._8_8_ = uVar2;
  pVar3.first.message._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (unique_ptr<char[],_std::default_delete<char[]>_>)
                 (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
  return pVar3;
}

Assistant:

static std::pair<error, int> parse_insn(context& ctx, opcode& op, const insn& insn)
{
    op.add_bits(insn.opcode);

    token token = ctx.tokenize();
    if ((insn.flags & NO_PRED) && (~op.value & (7ULL << 16))) {
        return {fail(token, "%s does not support predicated execution", insn.mnemonic), 0};
    }
    int score = 1;
    for (const operand& operand : insn.operands) {
        if (error message = operand(ctx, token, op); message) {
            return {std::move(message), score};
        }
        ++score;
    }
    score += 1000; // A number high enough to have better score than any number of operands

    if (error message = assemble_sched(ctx, token, op); message) {
        return {std::move(message), score};
    }
    return {confirm_type(token, token_type::semicolon), score};
}